

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::DeepScanLineInputFile::~DeepScanLineInputFile(DeepScanLineInputFile *this)

{
  IStream *pIVar1;
  char *pcVar2;
  InputStreamMutex *pIVar3;
  Data *this_00;
  pointer ppLVar4;
  ulong uVar5;
  
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__DeepScanLineInputFile_00380998;
  if ((this->_data->_deleteStream == true) &&
     (pIVar1 = this->_data->_streamData->is, pIVar1 != (IStream *)0x0)) {
    (*pIVar1->_vptr_IStream[1])();
  }
  if (this->_data != (Data *)0x0) {
    if ((this->_data->memoryMapped == false) &&
       (ppLVar4 = (this->_data->lineBuffers).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       (this->_data->lineBuffers).
       super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
       ._M_impl.super__Vector_impl_data._M_finish != ppLVar4)) {
      uVar5 = 0;
      do {
        pcVar2 = (ppLVar4[uVar5]->buffer)._data;
        if (pcVar2 != (char *)0x0) {
          operator_delete__(pcVar2);
        }
        uVar5 = uVar5 + 1;
        ppLVar4 = (this->_data->lineBuffers).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(this->_data->lineBuffers).
                                     super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar4 >> 3
                              ));
    }
    if ((this->_data->partNumber == -1) &&
       (pIVar3 = this->_data->_streamData, pIVar3 != (InputStreamMutex *)0x0)) {
      operator_delete(pIVar3,0x38);
    }
    this_00 = this->_data;
    if (this_00 != (Data *)0x0) {
      Data::~Data(this_00);
      operator_delete(this_00,0x208);
    }
  }
  GenericInputFile::~GenericInputFile(&this->super_GenericInputFile);
  return;
}

Assistant:

DeepScanLineInputFile::~DeepScanLineInputFile ()
{
    if (_data->_deleteStream)
        delete _data->_streamData->is;

    if (_data)
    {
        if (!_data->memoryMapped)
            for (size_t i = 0; i < _data->lineBuffers.size(); i++)
                delete [] _data->lineBuffers[i]->buffer;

        //
        // Unless this file was opened via the multipart API, delete the streamdata
        // object too.
        // (TODO) it should be "isMultiPart(data->version)", but when there is only
        // single part,
        // (see the above constructor) the version field is not set.
        //
        // (TODO) we should have a way to tell if the stream data is owned by this
        // file or by a parent multipart file.
        //

        if (_data->partNumber == -1 && _data->_streamData)
        {
            delete _data->_streamData;
        }
        delete _data;
    }
}